

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O3

CURLcode smtp_do(Curl_easy *data,_Bool *done)

{
  curl_mimepart *part;
  uint *puVar1;
  byte bVar2;
  SMTP *pSVar3;
  curl_trc_feat *pcVar4;
  _Bool _Var5;
  CURLcode CVar6;
  char *pcVar7;
  char *pcVar8;
  curl_off_t cVar9;
  char *pcVar10;
  ulong uVar11;
  bool bVar12;
  ulong uVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  connectdata *pcVar18;
  curl_slist *pcVar19;
  char *pcVar20;
  char *address;
  connectdata *local_60;
  hostname host;
  
  *done = false;
  pcVar7 = (data->set).str[0x1c];
  if ((pcVar7 != (char *)0x0) &&
     (CVar6 = Curl_urldecode(pcVar7,0,&((data->req).p.file)->freepath,(size_t *)0x0,REJECT_CTRL),
     CVar6 != CURLE_OK)) {
    return CVar6;
  }
  (data->req).size = -1;
  Curl_pgrsSetUploadCounter(data,0);
  Curl_pgrsSetDownloadCounter(data,0);
  Curl_pgrsSetUploadSize(data,-1);
  Curl_pgrsSetDownloadSize(data,-1);
  pSVar3 = (data->req).p.smtp;
  if ((((data->set).field_0x8cd & 0x10) != 0) &&
     (((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)) &&
      (0 < Curl_trc_feat_smtp.log_level)))) {
    Curl_trc_smtp(data,"smtp_perform(), start");
  }
  if (((data->req).field_0xdb & 2) != 0) {
    pSVar3->transfer = PPTRANSFER_INFO;
  }
  *done = false;
  pSVar3->rcpt = (data->set).mail_rcpt;
  pSVar3->rcpt_last_error = 0;
  pSVar3->field_0x28 = pSVar3->field_0x28 & 0xfc | 2;
  pSVar3->eob = 2;
  if (((((data->state).field_0x776 & 2) == 0) && ((data->set).mimepost.kind == MIMEKIND_NONE)) ||
     ((data->set).mail_rcpt == (curl_slist *)0x0)) {
    CVar6 = smtp_perform_command(data);
    if (CVar6 != CURLE_OK) {
      uVar13 = (ulong)CVar6;
      goto LAB_00154add;
    }
  }
  else {
    pcVar18 = data->conn;
    pcVar7 = (data->set).str[0x36];
    if (pcVar7 == (char *)0x0) {
      pcVar7 = (*Curl_cstrdup)("<>");
      bVar12 = false;
LAB_001549a1:
      uVar13 = 0x1b;
      if (pcVar7 == (char *)0x0) goto LAB_00154a00;
      pcVar10 = (data->set).str[0x37];
      if ((pcVar10 == (char *)0x0) || (*(short *)((long)&pcVar18->proto + 0xbc) == 0)) {
        pcVar10 = (char *)0x0;
LAB_00154a10:
        if ((data->set).mimepost.kind == MIMEKIND_NONE) {
          CVar6 = Curl_creader_set_fread(data,(data->state).infilesize);
          if (CVar6 == CURLE_OK) goto LAB_00154bf5;
        }
        else {
          part = &(data->set).mimepost;
          puVar1 = &(data->set).mimepost.flags;
          *(byte *)puVar1 = (byte)*puVar1 & 0xfd;
          local_60 = pcVar18;
          curl_mime_headers(part,(data->set).headers,0);
          CVar6 = Curl_mime_prepare_headers(data,part,(char *)0x0,(char *)0x0,MIMESTRATEGY_MAIL);
          if ((CVar6 == CURLE_OK) &&
             (((pcVar8 = Curl_checkheaders(data,"Mime-Version",0xc), pcVar8 != (char *)0x0 ||
               (CVar6 = Curl_mime_add_header(&(data->set).mimepost.curlheaders,"Mime-Version: 1.0"),
               CVar6 == CURLE_OK)) && (CVar6 = Curl_creader_set_mime(data,part), CVar6 == CURLE_OK))
             )) {
            cVar9 = Curl_creader_total_length(data);
            (data->state).infilesize = cVar9;
            pcVar18 = local_60;
LAB_00154bf5:
            bVar2 = *(byte *)((long)&pcVar18->proto + 0xd0);
            if (((bVar2 & 4) == 0) || ((data->state).infilesize < 1)) {
              pcVar8 = (char *)0x0;
            }
            else {
              pcVar8 = curl_maprintf("%ld");
              pcVar17 = (char *)0x0;
              if (pcVar8 == (char *)0x0) goto LAB_00154ac0;
              bVar2 = *(byte *)((long)&pcVar18->proto + 0xd0);
            }
            local_60 = pcVar18;
            if ((((bVar2 & 8) != 0) && (!bVar12)) &&
               (pcVar19 = ((data->req).p.smtp)->rcpt, pcVar19 != (curl_slist *)0x0)) {
              do {
                _Var5 = Curl_is_ASCII_name(pcVar19->data);
                if (!_Var5) {
                  bVar12 = true;
                }
                pcVar19 = pcVar19->next;
              } while ((pcVar19 != (curl_slist *)0x0) && (!bVar12));
            }
            host.rawalloc = (char *)0x0;
            CVar6 = Curl_creader_create((Curl_creader **)&host,data,&cr_eob,CURL_CR_CONTENT_ENCODE);
            if (CVar6 == CURLE_OK) {
              CVar6 = Curl_creader_add(data,(Curl_creader *)host.rawalloc);
            }
            uVar13 = (ulong)CVar6;
            pcVar17 = pcVar8;
            if (host.rawalloc == (char *)0x0 || CVar6 == CURLE_OK) {
              if (CVar6 == CURLE_OK) {
                pcVar14 = " AUTH=";
                pcVar15 = pcVar10;
                if (pcVar10 == (char *)0x0) {
                  pcVar14 = "";
                  pcVar15 = "";
                }
                pcVar16 = " SIZE=";
                if (pcVar8 == (char *)0x0) {
                  pcVar16 = "";
                  pcVar8 = "";
                }
                pcVar20 = " SMTPUTF8";
                if (!bVar12) {
                  pcVar20 = "";
                }
                CVar6 = Curl_pp_sendf(data,&(local_60->proto).ftpc.pp,"MAIL FROM:%s%s%s%s%s%s",
                                      pcVar7,pcVar14,pcVar15,pcVar16,pcVar8,pcVar20);
                uVar13 = (ulong)CVar6;
              }
            }
            else {
              Curl_creader_free(data,(Curl_creader *)host.rawalloc);
            }
            goto LAB_00154ac0;
          }
        }
LAB_00154ab9:
        uVar13 = (ulong)CVar6;
        pcVar17 = (char *)0x0;
      }
      else {
        if (*pcVar10 != '\0') {
          address = (char *)0x0;
          host.name = (char *)0x0;
          host.dispname = (char *)0x0;
          host.rawalloc = (char *)0x0;
          host.encalloc = (char *)0x0;
          CVar6 = smtp_parse_address(pcVar10,&address,&host);
          if (CVar6 == CURLE_OK) {
            if (((!bVar12) && ((*(byte *)((long)&pcVar18->proto + 0xd0) & 8) != 0)) &&
               ((host.encalloc != (char *)0x0 ||
                ((_Var5 = Curl_is_ASCII_name(address), !_Var5 ||
                 (_Var5 = Curl_is_ASCII_name(host.name), !_Var5)))))) {
              bVar12 = true;
            }
            pcVar8 = address;
            if (host.name == (char *)0x0) {
              pcVar10 = curl_maprintf("<%s>",address);
            }
            else {
              pcVar10 = curl_maprintf("<%s@%s>",address);
            }
            (*Curl_cfree)(pcVar8);
            goto LAB_00154e27;
          }
          pcVar10 = (char *)0x0;
          goto LAB_00154ab9;
        }
        pcVar10 = (*Curl_cstrdup)("<>");
LAB_00154e27:
        if (pcVar10 != (char *)0x0) goto LAB_00154a10;
        pcVar10 = (char *)0x0;
        pcVar17 = (char *)0x0;
      }
    }
    else {
      address = (char *)0x0;
      host.name = (char *)0x0;
      host.dispname = (char *)0x0;
      host.rawalloc = (char *)0x0;
      host.encalloc = (char *)0x0;
      CVar6 = smtp_parse_address(pcVar7,&address,&host);
      pcVar10 = address;
      if (CVar6 == CURLE_OK) {
        if ((*(byte *)((long)&pcVar18->proto + 0xd0) & 8) == 0) {
          bVar12 = false;
        }
        else {
          bVar12 = true;
          if ((host.encalloc == (char *)0x0) && (_Var5 = Curl_is_ASCII_name(address), _Var5)) {
            _Var5 = Curl_is_ASCII_name(host.name);
            bVar12 = !_Var5;
          }
        }
        if (host.name == (char *)0x0) {
          pcVar7 = curl_maprintf("<%s>",pcVar10);
        }
        else {
          pcVar7 = curl_maprintf("<%s@%s>",pcVar10);
        }
        (*Curl_cfree)(pcVar10);
        goto LAB_001549a1;
      }
      uVar13 = (ulong)CVar6;
LAB_00154a00:
      pcVar10 = (char *)0x0;
      pcVar7 = (char *)0x0;
      pcVar17 = (char *)0x0;
    }
LAB_00154ac0:
    (*Curl_cfree)(pcVar7);
    (*Curl_cfree)(pcVar10);
    (*Curl_cfree)(pcVar17);
    if ((int)uVar13 != 0) {
LAB_00154add:
      uVar11 = 0;
      goto LAB_00154b09;
    }
    smtp_state(data,SMTP_MAIL);
  }
  CVar6 = smtp_multi_statemach(data,done);
  uVar13 = (ulong)CVar6;
  _Var5 = Curl_conn_is_connected(data->conn,0);
  uVar11 = (ulong)_Var5;
LAB_00154b09:
  if ((((data->set).field_0x8cd & 0x10) != 0) &&
     (((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)) &&
      (0 < Curl_trc_feat_smtp.log_level)))) {
    Curl_trc_smtp(data,"smtp_perform() -> %d, connected=%d, done=%d",uVar13,uVar11,(ulong)*done);
  }
  if ((((CURLcode)uVar13 == CURLE_OK) && (*done == true)) &&
     (((data->req).p.imap)->transfer != PPTRANSFER_BODY)) {
    Curl_xfer_setup_nop(data);
  }
  if ((((data->set).field_0x8cd & 0x10) != 0) &&
     ((((pcVar4 = (data->state).feat, pcVar4 != (curl_trc_feat *)0x0 && (pcVar4->log_level < 1)) ||
       ((Curl_trc_feat_smtp.log_level < 1 ||
        (Curl_trc_smtp(data,"smtp_regular_transfer() -> %d, done=%d",uVar13,(ulong)*done),
        ((data->set).field_0x8cd & 0x10) != 0)))) &&
      (((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)) &&
       (0 < Curl_trc_feat_smtp.log_level)))))) {
    Curl_trc_smtp(data,"smtp_do() -> %d, done=%d",uVar13,(ulong)*done);
  }
  return (CURLcode)uVar13;
}

Assistant:

static CURLcode smtp_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);
  *done = FALSE; /* default to false */

  /* Parse the custom request */
  result = smtp_parse_custom_request(data);
  if(result)
    return result;

  result = smtp_regular_transfer(data, done);
  CURL_TRC_SMTP(data, "smtp_do() -> %d, done=%d", result, *done);
  return result;
}